

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_unordered_quiet_mips64el(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = b.high;
  uVar3 = a.high;
  uVar4 = 0xffffffffffff;
  if (((~uVar3 & 0x7fff000000000000) != 0) ||
     (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      a.low == 0)) {
    if ((~uVar1 & 0x7fff000000000000) != 0) {
      return 0;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        b.low == 0) {
      return 0;
    }
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar3 & 0x7fff800000000000) == 0x7fff000000000000) {
      uVar2 = 0x7fffffffffff;
      goto LAB_009323d4;
    }
  }
  else {
    uVar2 = 0xffffffffffff;
    if (0xfffeffffffffffff < uVar3 * 2) {
LAB_009323d4:
      if ((uVar2 & uVar3) != 0 || a.low != 0) goto LAB_00932419;
    }
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar1 & 0x7fff800000000000) != 0x7fff000000000000) {
      return 1;
    }
    uVar4 = 0x7fffffffffff;
  }
  else if (uVar1 * 2 < 0xffff000000000000) {
    return 1;
  }
  if (b.low == 0 && (uVar4 & uVar1) == 0) {
    return 1;
  }
LAB_00932419:
  status->float_exception_flags = status->float_exception_flags | 1;
  return 1;
}

Assistant:

int float128_unordered_quiet(float128 a, float128 b, float_status *status)
{
    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}